

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

void ddSupportStep(DdNode *f,int *support)

{
  if (((ulong)f->index != 0x7fffffff) && (((ulong)f->next & 1) == 0)) {
    support[f->index] = 1;
    ddSupportStep((f->type).kids.T,support);
    ddSupportStep((DdNode *)((ulong)(f->type).kids.E & 0xfffffffffffffffe),support);
    *(byte *)&f->next = *(byte *)&f->next ^ 1;
  }
  return;
}

Assistant:

static void
ddSupportStep(
  DdNode * f,
  int * support)
{
    if (cuddIsConstant(f) || Cudd_IsComplement(f->next)) {
        return;
    }

    support[f->index] = 1;
    ddSupportStep(cuddT(f),support);
    ddSupportStep(Cudd_Regular(cuddE(f)),support);
    /* Mark as visited. */
    f->next = Cudd_Not(f->next);
    return;

}